

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::foreign_call_1::~foreign_call_1(foreign_call_1 *this)

{
  foreign_call_1 *this_local;
  
  ~foreign_call_1(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      external_function ef;
      ef.name = "seventeen";
      ef.address = (uint64_t)&seventeen;
      ef.return_type = external_function::T_INT64;
      externals[ef.name] = ef;
      TEST_EQ("17", run("(foreign-call seventeen)"));
      }